

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::
UntypedPerformAction
          (FunctionMockerBase<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestCountExpr> *pAVar1;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *in_RDX;
  ArgumentTuple *args;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> action;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> local_28;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *local_18;
  
  local_18 = in_RDX;
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::Action
            (&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<TestCountExpr>::
           PerformAction<TestCountExpr(TestExprBuilder<3,BasicTestExpr<2>>)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)>::~Action
            ((Action<TestCountExpr_(TestExprBuilder<3,_BasicTestExpr<2>_>)> *)0x2b78d1);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }